

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::DrawReadBuffersErrorsTest::PrepareObjects
          (DrawReadBuffersErrorsTest *this)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ulong uVar7;
  GLenum *pGVar8;
  int local_28;
  int local_24;
  GLint i_1;
  GLint max_draw_buffers;
  GLint i;
  bool is_attachment;
  Functions *gl;
  DrawReadBuffersErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  _i = CONCAT44(extraout_var,iVar4);
  (**(code **)(_i + 0x6d0))(1,&this->m_fbo_valid);
  dVar5 = (**(code **)(_i + 0x800))();
  glu::checkError(dVar5,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1613);
  (**(code **)(_i + 0x78))(0x8d40,this->m_fbo_valid);
  dVar5 = (**(code **)(_i + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1616);
  do {
    pcVar1 = *(code **)(_i + 0xc88);
    this->m_fbo_invalid = this->m_fbo_invalid + 1;
    cVar3 = (*pcVar1)();
  } while (cVar3 != '\0');
  (**(code **)(_i + 0x868))(0x8cdf,&this->m_max_color_attachments);
  max_draw_buffers._3_1_ = '\x01';
  do {
    if (max_draw_buffers._3_1_ == '\0') {
      this->m_attachments_invalid[0] = 0x8ce0;
      this->m_attachments_invalid[1] = 0x8ce0;
      local_24 = 8;
      (**(code **)(_i + 0x868))(0x8824,&local_24);
      this->m_attachments_too_many_count = local_24 + 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)this->m_attachments_too_many_count;
      uVar7 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      pGVar8 = (GLenum *)operator_new__(uVar7);
      this->m_attachments_too_many = pGVar8;
      *this->m_attachments_too_many = 0x8ce0;
      for (local_28 = 1; local_28 < this->m_attachments_too_many_count; local_28 = local_28 + 1) {
        this->m_attachments_too_many[local_28] = 0;
      }
      return;
    }
    this->m_attachment_invalid = this->m_attachment_invalid + 1;
    max_draw_buffers._3_1_ = '\0';
    if ((this->m_attachment_invalid == 0) || (this->m_attachment_invalid - 0x400 < 9)) {
      max_draw_buffers._3_1_ = '\x01';
    }
    for (i_1 = 0; i_1 < this->m_max_color_attachments; i_1 = i_1 + 1) {
      if (i_1 + 0x8ce0U == this->m_attachment_invalid) {
        max_draw_buffers._3_1_ = '\x01';
        break;
      }
    }
  } while( true );
}

Assistant:

void DrawReadBuffersErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;

	/* Invalid attachment. */
	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &m_max_color_attachments);

	bool is_attachment = true;

	while (is_attachment)
	{
		++m_attachment_invalid;

		is_attachment = false;

		/* Valid attachments are those from tables 17.4, 17.5 and a 17.6 (valid for various functions and framebuffer types).
		 (see OpenGL 4.5 Core Profile Specification) */
		switch (m_attachment_invalid)
		{
		case GL_NONE:
		case GL_FRONT_LEFT:
		case GL_FRONT_RIGHT:
		case GL_BACK_LEFT:
		case GL_BACK_RIGHT:
		case GL_FRONT:
		case GL_BACK:
		case GL_LEFT:
		case GL_RIGHT:
		case GL_FRONT_AND_BACK:
			is_attachment = true;
		};

		for (glw::GLint i = 0; i < m_max_color_attachments; ++i)
		{
			if ((glw::GLenum)(GL_COLOR_ATTACHMENT0 + i) == m_attachment_invalid)
			{
				is_attachment = true;
				break;
			}
		}
	}

	m_attachments_invalid[0] = GL_COLOR_ATTACHMENT0;
	m_attachments_invalid[1] = GL_COLOR_ATTACHMENT0;

	glw::GLint max_draw_buffers = 8; /* Spec default. */
	gl.getIntegerv(GL_MAX_DRAW_BUFFERS, &max_draw_buffers);

	m_attachments_too_many_count = max_draw_buffers + 1;

	m_attachments_too_many = new glw::GLenum[m_attachments_too_many_count];

	m_attachments_too_many[0] = GL_COLOR_ATTACHMENT0;

	for (glw::GLint i = 1; i < m_attachments_too_many_count; ++i)
	{
		m_attachments_too_many[i] = GL_NONE;
	}
}